

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.cpp
# Opt level: O0

string * EncodeBase58Check_abi_cxx11_(Span<const_unsigned_char> input)

{
  allocator_type *__a;
  uchar *__last;
  string *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> in_stack_00000040;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  uint256 hash;
  Span<const_unsigned_char> *in_stack_ffffffffffffff18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  Span<const_unsigned_char> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uchar *in_stack_ffffffffffffff68;
  const_iterator in_stack_ffffffffffffff78;
  undefined1 local_51 [25];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in1 = local_38;
  __a = (allocator_type *)Span<const_unsigned_char>::begin(in_stack_ffffffffffffff18);
  __last = Span<const_unsigned_char>::end(in_stack_ffffffffffffff18);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_51;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffff18);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            (this_00,in_stack_ffffffffffffff68,__last,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffff18);
  Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>(in1);
  this = (Span<const_unsigned_char> *)(local_51 + 1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff20);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)this,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffff20);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a,in_stack_ffffffffffffff78,
             (uchar *)in1,(uchar *)in_RDI);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (this,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  EncodeBase58_abi_cxx11_(in_stack_00000040);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeBase58Check(Span<const unsigned char> input)
{
    // add 4-byte hash check to the end
    std::vector<unsigned char> vch(input.begin(), input.end());
    uint256 hash = Hash(vch);
    vch.insert(vch.end(), (unsigned char*)&hash, (unsigned char*)&hash + 4);
    return EncodeBase58(vch);
}